

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::upgradeToWebSocket
          (anon_unknown_31 *this,Own<kj::AsyncIoStream> *stream,HttpInputStreamImpl *httpInput,
          HttpOutputStream *httpOutput,Maybe<kj::EntropySource_&> maskKeyGenerator)

{
  PromiseNode *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  Own<kj::WebSocket> OVar10;
  ReleasedBuffer releasedBuffer;
  HttpOutputStream local_78;
  ArrayDisposer *local_58;
  char *local_50;
  WebSocket *local_48;
  EntropySource *local_38;
  
  pPVar1 = (PromiseNode *)(httpInput->headerBuffer).ptr;
  sVar2 = (httpInput->headerBuffer).size_;
  pAVar3 = (httpInput->headerBuffer).disposer;
  (httpInput->headerBuffer).ptr = (char *)0x0;
  (httpInput->headerBuffer).size_ = 0;
  pcVar4 = (httpInput->leftover).ptr;
  local_48 = (WebSocket *)(httpInput->leftover).size_;
  local_78.writeQueue.super_PromiseBase.node.ptr = pPVar1;
  local_78._24_8_ = sVar2;
  local_58 = pAVar3;
  local_50 = pcVar4;
  local_38 = maskKeyGenerator.ptr;
  HttpOutputStream::flush(&local_78);
  puVar9 = (undefined8 *)operator_new(0xe0);
  uVar5 = *(undefined4 *)&stream->disposer;
  uVar6 = *(undefined4 *)((long)&stream->disposer + 4);
  uVar7 = *(undefined4 *)&stream->ptr;
  uVar8 = *(undefined4 *)((long)&stream->ptr + 4);
  stream->ptr = (AsyncIoStream *)0x0;
  *puVar9 = &PTR_send_0045f648;
  *(undefined4 *)(puVar9 + 1) = uVar5;
  *(undefined4 *)((long)puVar9 + 0xc) = uVar6;
  *(undefined4 *)(puVar9 + 2) = uVar7;
  *(undefined4 *)((long)puVar9 + 0x14) = uVar8;
  puVar9[3] = local_38;
  *(undefined2 *)(puVar9 + 4) = 0;
  *(undefined1 *)((long)puVar9 + 0x22) = 0;
  puVar9[7] = 0;
  puVar9[8] = 0;
  puVar9[9] = 0;
  puVar9[10] = 0;
  *(undefined1 *)(puVar9 + 0xb) = 0;
  *(undefined1 *)(puVar9 + 0xf) = 1;
  *(undefined4 *)(puVar9 + 0x10) = local_78.inner._0_4_;
  *(undefined4 *)((long)puVar9 + 0x84) = local_78.inner._4_4_;
  *(undefined4 *)(puVar9 + 0x11) = local_78.writeQueue.super_PromiseBase.node.disposer._0_4_;
  *(undefined4 *)((long)puVar9 + 0x8c) = local_78.writeQueue.super_PromiseBase.node.disposer._4_4_;
  *(undefined4 *)(puVar9 + 0x12) = 0;
  puVar9[0x13] = 0;
  puVar9[0x14] = 0;
  puVar9[0x15] = 0;
  puVar9[0x17] = pPVar1;
  puVar9[0x18] = sVar2;
  puVar9[0x19] = pAVar3;
  puVar9[0x1a] = pcVar4;
  puVar9[0x1b] = local_48;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::instance;
  *(undefined8 **)(this + 8) = puVar9;
  OVar10.ptr = local_48;
  OVar10.disposer = (Disposer *)this;
  return OVar10;
}

Assistant:

kj::Own<WebSocket> upgradeToWebSocket(
    kj::Own<kj::AsyncIoStream> stream, HttpInputStreamImpl& httpInput, HttpOutputStream& httpOutput,
    kj::Maybe<EntropySource&> maskKeyGenerator) {
  // Create a WebSocket upgraded from an HTTP stream.
  auto releasedBuffer = httpInput.releaseBuffer();
  return kj::heap<WebSocketImpl>(kj::mv(stream), maskKeyGenerator,
                                 kj::mv(releasedBuffer.buffer), releasedBuffer.leftover,
                                 httpOutput.flush());
}